

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:403:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:403:35)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  ReaderOptions receiveOptions;
  undefined1 auStack_1b8 [16];
  RpcSystem<capnp::rpc::twoparty::VatId> server;
  TwoPartyVatNetwork network;
  
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  capnp::TwoPartyVatNetwork::TwoPartyVatNetwork(&network,params_1,SERVER,receiveOptions);
  capnp::
  makeRpcServer<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&server,&network.super_TwoPartyVatNetworkBase,(this->f).bootstrapFactory);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)auStack_1b8);
  Promise<void>::wait((Promise<void> *)auStack_1b8,params_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)auStack_1b8);
  capnp::_::RpcSystemBase::~RpcSystemBase(&server.super_RpcSystemBase);
  capnp::TwoPartyVatNetwork::~TwoPartyVatNetwork(&network);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }